

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weak.c
# Opt level: O2

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  int *piVar2;
  sexp_conflict psVar3;
  sexp_conflict local_78;
  sexp_conflict local_70;
  sexp_conflict name;
  sexp_gc_var_t local_60;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  name = (sexp_conflict)0x43e;
  local_70 = (sexp_conflict)0x43e;
  iVar1 = strcmp(version,"0.11.0");
  psVar3 = (sexp_conflict)0xb3e;
  if (iVar1 == 0) {
    iVar1 = strncmp(abi,"cv-gm*uh",8);
    if (iVar1 == 0) {
      local_60.var = &name;
      local_40.next = &local_60;
      local_60.next = (ctx->value).context.saves;
      local_40.var = &local_78;
      local_50.next = &local_40;
      local_50.var = &local_70;
      (ctx->value).context.saves = &local_50;
      local_78 = (sexp_conflict)0x51;
      name = (sexp_conflict)sexp_c_string(ctx,"ephemeron?",0xffffffffffffffff);
      local_70 = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,name,local_78);
      name = (sexp_conflict)sexp_intern(ctx,"ephemeron?",0xffffffffffffffff);
      sexp_env_define(ctx,env,name,local_70);
      name = (sexp_conflict)sexp_c_string(ctx,"ephemeron-key",0xffffffffffffffff);
      local_70 = (sexp_conflict)sexp_make_getter_op(ctx,0,3,name,local_78,1);
      name = (sexp_conflict)sexp_intern(ctx,"ephemeron-key",0xffffffffffffffff);
      sexp_env_define(ctx,env,name,local_70);
      name = (sexp_conflict)sexp_c_string(ctx,"ephemeron-value",0xffffffffffffffff);
      local_70 = (sexp_conflict)sexp_make_getter_op(ctx,0,3,name,local_78,3);
      name = (sexp_conflict)sexp_intern(ctx,"ephemeron-value",0xffffffffffffffff);
      sexp_env_define(ctx,env,name,local_70);
      local_70 = (sexp_conflict)
                 sexp_define_foreign_aux
                           (ctx,env,"make-ephemeron",2,0,"sexp_make_ephemeron_op",
                            sexp_make_ephemeron_op,0);
      if ((((ulong)local_70 & 3) == 0) && (local_70->tag == 0x1b)) {
        (local_70->value).bytecode.max_depth = 0x51;
      }
      piVar2 = (int *)sexp_define_foreign_aux
                                (ctx,env,"ephemeron-broken?",1,0,"sexp_ephemeron_brokenp_op",
                                 sexp_ephemeron_brokenp_op,0);
      if ((((ulong)piVar2 & 3) == 0) && (*piVar2 == 0x1b)) {
        piVar2[10] = 1;
        piVar2[0xb] = 0;
        piVar2[0xc] = 0x51;
        piVar2[0xd] = 0;
      }
      (ctx->value).context.saves = local_60.next;
      psVar3 = (sexp_conflict)0x43e;
    }
  }
  return psVar3;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
#if 0
  sexp v;
  int sexp_weak_vector_id;
#endif
  sexp_gc_var3(name, t, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, t, op);

#if SEXP_USE_WEAK_REFERENCES
  t = sexp_make_fixnum(SEXP_EPHEMERON);
  op = sexp_make_type_predicate(ctx, name=sexp_c_string(ctx,"ephemeron?",-1), t);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "ephemeron?", -1), op);
  op = sexp_make_getter(ctx, name=sexp_c_string(ctx, "ephemeron-key", -1), t, SEXP_ZERO);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "ephemeron-key", -1), op);
  op = sexp_make_getter(ctx, name=sexp_c_string(ctx, "ephemeron-value", -1), t, SEXP_ONE);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "ephemeron-value", -1), op);
  op = sexp_define_foreign(ctx, env, "make-ephemeron", 2, sexp_make_ephemeron_op);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_EPHEMERON);
  }
  op = sexp_define_foreign(ctx, env, "ephemeron-broken?", 1, sexp_ephemeron_brokenp_op);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_EPHEMERON);
  }
#endif

#if 0
  name = sexp_c_string(ctx, "Weak-Vector", -1);
  t = sexp_register_simple_type(ctx, name, SEXP_FALSE, SEXP_ZERO);
  v = sexp_type_by_index(ctx, SEXP_VECTOR);
  sexp_weak_vector_id = sexp_type_tag(t);
  sexp_type_weak_base(t) = sexp_type_field_base(v);
  sexp_type_weak_len_off(t) = sexp_type_field_len_off(v);
  sexp_type_weak_len_scale(t) = sexp_type_field_len_scale(v);

  op = sexp_make_type_predicate(ctx, name=sexp_c_string(ctx,"weak-vector?",-1), t);
  sexp_env_define(ctx, env, name=sexp_intern(ctx, "weak-vector?", -1), op);
  op = sexp_define_foreign(ctx, env, "make-weak-vector", 1, sexp_make_weak_vector);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "weak-vector-length", 2, sexp_weak_vector_length);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
  }
  op = sexp_define_foreign(ctx, env, "weak-vector-ref", 2, sexp_weak_vector_ref);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "weak-vector-set!", 3, sexp_weak_vector_set);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(sexp_weak_vector_id);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
#endif

  sexp_gc_release3(ctx);
  return SEXP_VOID;
}